

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

string * __thiscall
duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>::StatsToString
          (string *__return_storage_ptr__,NumericStatsUnifier<duckdb::timestamp_tz_t> *this,
          string *stats)

{
  Value local_50;
  
  if (stats->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    Value::CreateValue<duckdb::timestamp_tz_t>
              (&local_50,(timestamp_tz_t)((timestamp_t *)(stats->_M_dataplus)._M_p)->value);
    Value::ToString_abi_cxx11_(__return_storage_ptr__,&local_50);
    Value::~Value(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string StatsToString(const string &stats) override {
		if (stats.empty()) {
			return string();
		}
		return Value::CreateValue<T>(Load<T>(const_data_ptr_cast(stats.data()))).ToString();
	}